

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsMulti
          (BeagleCPUImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *scalingFactorsIndices,int count,double *outSumLogLikelihood)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  double **ppdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  int j;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  double *pdVar20;
  ulong uVar21;
  int k;
  long lVar22;
  long lVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  allocator_type local_121;
  double *local_120;
  ulong local_118;
  double *local_110;
  BeagleCPUImpl<double,_1,_0> *local_108;
  long local_100;
  ulong local_f8;
  int local_ec;
  uint local_e8;
  uint local_e4;
  double *local_e0;
  double *local_d8;
  int *local_d0;
  int *local_c8;
  int *local_c0;
  int *local_b8;
  int *local_b0;
  ulong local_a8;
  ulong local_a0;
  double *local_98;
  double *local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  long local_70;
  long local_68;
  vector<double,_std::allocator<double>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  
  local_d0 = parentBufferIndices;
  local_c8 = childBufferIndices;
  local_c0 = probabilityIndices;
  local_b8 = categoryWeightsIndices;
  local_b0 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&indexMaxScale,(long)this->kPatternCount,(allocator_type *)&maxScaleFactor);
  std::vector<double,_std::allocator<double>_>::vector
            (&maxScaleFactor,(long)this->kPatternCount,&local_121);
  local_100 = (long)count;
  local_a0 = (ulong)(count - 1);
  local_a8 = (ulong)(uint)(~(count >> 0x1f) & count);
  local_108 = this;
  for (uVar17 = 0; uVar17 != local_a8; uVar17 = uVar17 + 1) {
    local_d8 = this->gPartials[local_d0[uVar17]];
    local_120 = this->gTransitionMatrices[local_c0[uVar17]];
    local_e0 = this->gCategoryWeights[local_b8[uVar17]];
    local_110 = this->gStateFrequencies[local_b0[uVar17]];
    iVar16 = local_c8[uVar17];
    local_118 = uVar17;
    memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
    if ((iVar16 < this->kTipCount) && (piVar9 = this->gTipStates[iVar16], piVar9 != (int *)0x0)) {
      uVar5 = this->kPatternCount;
      lVar19 = 0;
      local_f8 = (ulong)(uint)(~(this->kCategoryCount >> 0x1f) & this->kCategoryCount);
      for (uVar17 = 0; uVar17 != local_f8; uVar17 = uVar17 + 1) {
        uVar6 = this->kStateCount;
        iVar16 = this->kPartialsPaddedStateCount;
        iVar7 = this->kMatrixSize;
        lVar19 = (long)(int)lVar19;
        lVar22 = 0;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = local_e0[uVar17];
        pdVar13 = local_d8 + lVar19;
        for (uVar21 = 0; uVar21 != (~((int)uVar5 >> 0x1f) & uVar5); uVar21 = uVar21 + 1) {
          lVar22 = (long)(int)lVar22;
          iVar8 = local_108->kTransPaddedStateCount;
          pdVar11 = local_108->integrationTmp;
          pdVar12 = local_120 + (long)(iVar7 * (int)uVar17) + (long)piVar9[uVar21];
          for (uVar14 = 0; (~((int)uVar6 >> 0x1f) & uVar6) != uVar14; uVar14 = uVar14 + 1) {
            dVar24 = *pdVar12;
            pdVar12 = pdVar12 + iVar8;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = pdVar11[lVar22 + uVar14];
            auVar29._8_8_ = 0;
            auVar29._0_8_ = dVar24 * pdVar13[uVar14];
            auVar26 = vfmadd213sd_fma(auVar29,auVar25,auVar1);
            pdVar11[lVar22 + uVar14] = auVar26._0_8_;
          }
          lVar19 = lVar19 + iVar16;
          lVar22 = lVar22 + uVar14;
          pdVar13 = pdVar13 + iVar16;
        }
        this = local_108;
      }
    }
    else {
      uVar5 = this->kStateCount;
      local_90 = this->gPartials[iVar16];
      local_98 = local_90 + 2;
      lVar19 = 0;
      local_f8 = CONCAT44(local_f8._4_4_,uVar5 + 1);
      local_e8 = ~(this->kPatternCount >> 0x1f) & this->kPatternCount;
      local_88 = (ulong)(uint)(~(this->kCategoryCount >> 0x1f) & this->kCategoryCount);
      uVar17 = 0;
      while (uVar21 = uVar17, uVar21 != local_88) {
        local_70 = (long)this->kPartialsPaddedStateCount;
        lVar22 = (long)(int)lVar19;
        lVar23 = 0;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = local_e0[uVar21];
        local_78 = local_70 * 8;
        local_ec = this->kMatrixSize * (int)uVar21;
        pdVar13 = local_98 + lVar22;
        pdVar12 = local_90 + lVar22;
        uVar6 = 0;
        while (uVar15 = uVar6, lVar19 = lVar22, uVar15 != local_e8) {
          lVar23 = (long)(int)lVar23;
          uVar17 = 0;
          pdVar11 = local_108->integrationTmp;
          iVar16 = local_ec;
          while (uVar17 != (~((int)uVar5 >> 0x1f) & uVar5)) {
            auVar30 = ZEXT816(0) << 0x40;
            pdVar20 = pdVar12;
            for (lVar22 = 0; auVar25 = auVar30, lVar22 < (int)uVar5 / 4 << 2; lVar22 = lVar22 + 4) {
              pdVar20 = pdVar20 + 4;
              auVar30 = vfmadd231pd_fma(auVar30,*(undefined1 (*) [16])(local_120 + iVar16 + lVar22),
                                        *(undefined1 (*) [16])(pdVar13 + lVar22 + -2));
              auVar30 = vfmadd231pd_fma(auVar30,*(undefined1 (*) [16])
                                                 (local_120 + (long)iVar16 + lVar22 + 2),
                                        *(undefined1 (*) [16])(pdVar13 + lVar22));
            }
            while (lVar22 < (int)uVar5) {
              auVar33._8_8_ = 0;
              auVar33._0_8_ = local_120[iVar16 + lVar22];
              lVar22 = lVar22 + 1;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *pdVar20;
              auVar25 = vfmadd231sd_fma(auVar25,auVar33,auVar2);
              pdVar20 = pdVar20 + 1;
            }
            auVar2 = vshufpd_avx(auVar30,auVar30,1);
            iVar16 = iVar16 + uVar5 + 1;
            lVar22 = lVar19 + uVar17;
            uVar17 = uVar17 + 1;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = pdVar11[lVar23];
            auVar31._8_8_ = 0;
            auVar31._0_8_ = (auVar2._0_8_ + auVar25._0_8_) * local_d8[lVar22];
            auVar30 = vfmadd213sd_fma(auVar31,auVar26,auVar30);
            pdVar11[lVar23] = auVar30._0_8_;
            lVar23 = lVar23 + 1;
          }
          pdVar13 = pdVar13 + local_70;
          pdVar12 = pdVar12 + local_70;
          lVar22 = lVar19 + local_70;
          local_e4 = uVar15;
          local_68 = lVar19;
          uVar6 = uVar15 + 1;
        }
        this = local_108;
        local_80 = uVar21;
        uVar17 = uVar21 + 1;
      }
    }
    lVar22 = 0;
    pdVar13 = local_110;
    uVar17 = local_118;
    lVar19 = local_100;
    for (lVar23 = 0; lVar23 < this->kPatternCount; lVar23 = lVar23 + 1) {
      auVar26 = ZEXT816(0) << 0x40;
      uVar14 = (ulong)(uint)(~(this->kStateCount >> 0x1f) & this->kStateCount);
      for (uVar21 = 0; pdVar12 = auVar26._0_8_, uVar14 != uVar21; uVar21 = uVar21 + 1) {
        auVar27._8_8_ = 0;
        auVar27._0_8_ = pdVar13[uVar21];
        auVar3._8_8_ = 0;
        auVar3._0_8_ = this->integrationTmp[(long)(int)lVar22 + uVar21];
        auVar26 = vfmadd231sd_fma(auVar26,auVar27,auVar3);
      }
      if (*scalingFactorsIndices != -1) {
        ppdVar10 = this->gScaleBuffers;
        pdVar11 = ppdVar10[scalingFactorsIndices[uVar17]];
        if (uVar17 == 0) {
          indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar23] = 0;
          uVar18 = 0;
          dVar24 = pdVar11[lVar23];
          auVar28 = ZEXT864((ulong)dVar24);
          maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar23] = dVar24;
          for (uVar21 = 1; uVar17 = local_118, (long)uVar21 < lVar19; uVar21 = uVar21 + 1) {
            dVar24 = ppdVar10[scalingFactorsIndices[uVar21]][lVar23];
            if (auVar28._0_8_ < dVar24) {
              indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar23] = (int)uVar21;
              maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar23] = dVar24;
              auVar28 = ZEXT864((ulong)dVar24);
              uVar18 = uVar21 & 0xffffffff;
            }
          }
        }
        else {
          uVar18 = (ulong)(uint)indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar23];
        }
        pdVar13 = local_110;
        if (uVar17 != uVar18) {
          local_120 = pdVar12;
          dVar24 = exp(pdVar11[lVar23] -
                       maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar23]);
          pdVar12 = (double *)((double)local_120 * dVar24);
          pdVar13 = local_110;
          uVar17 = local_118;
          lVar19 = local_100;
        }
      }
      pdVar11 = this->outLogLikelihoodsTmp;
      if (uVar17 == 0) {
        pdVar11[lVar23] = (double)pdVar12;
      }
      else {
        dVar24 = (double)pdVar12 + pdVar11[lVar23];
        if (uVar17 == local_a0) {
          dVar24 = log(dVar24);
          pdVar11 = this->outLogLikelihoodsTmp;
          pdVar13 = local_110;
          uVar17 = local_118;
          lVar19 = local_100;
        }
        pdVar11[lVar23] = dVar24;
      }
      lVar22 = (long)(int)lVar22 + uVar14;
    }
  }
  uVar5 = this->kPatternCount;
  if (*scalingFactorsIndices == -1) {
    uVar17 = (ulong)(~((int)uVar5 >> 0x1f) & uVar5);
  }
  else {
    pdVar13 = this->outLogLikelihoodsTmp;
    uVar17 = (ulong)(~((int)uVar5 >> 0x1f) & uVar5);
    for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
      pdVar13[uVar21] =
           maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar21] + pdVar13[uVar21];
    }
  }
  auVar26 = ZEXT816(0) << 0x40;
  *outSumLogLikelihood = 0.0;
  pdVar13 = this->gPatternWeights;
  pdVar12 = this->outLogLikelihoodsTmp;
  for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
    auVar32._8_8_ = 0;
    auVar32._0_8_ = pdVar12[uVar21];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = pdVar13[uVar21];
    auVar26 = vfmadd231sd_fma(auVar26,auVar32,auVar4);
    *outSumLogLikelihood = auVar26._0_8_;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indexMaxScale.super__Vector_base<int,_std::allocator<int>_>);
  return (uint)!NAN(auVar26._0_8_) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsMulti(const int* parentBufferIndices,
                                                                   const int* childBufferIndices,
                                                                   const int* probabilityIndices,
                                                                   const int* categoryWeightsIndices,
                                                                   const int* stateFrequenciesIndices,
                                                                   const int* scalingFactorsIndices,
                                                                   int count,
                                                                   double* outSumLogLikelihood) {

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const REALTYPE* partialsParent = gPartials[parentBufferIndices[subsetIndex]];
        const REALTYPE* transMatrix = gTransitionMatrices[probabilityIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        int childIndex = childBufferIndices[subsetIndex];

        memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = 0; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }
        } else {
            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = 0;
            int stateCountModFour = (kStateCount / 4) * 4;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0;
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {
                    int w = l * kMatrixSize;
                    const REALTYPE* partialsChildPtr = &partialsChild[v];
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJA = 0.0, sumOverJB = 0.0;
                        int j = 0;
                        const REALTYPE* transMatrixPtr = &transMatrix[w];
                        for (; j < stateCountModFour; j += 4) {
                            sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                            sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                            sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                            sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                        }
                        for (; j < kStateCount; j++) {
                            sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                        }
//                        for(int j = 0; j < kStateCount; j++) {
//                            sumOverJ += transMatrix[w] * partialsChild[v + j];
//                            w++;
//                        }
                        integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                        u++;

                        w += kStateCount;

                        // increment for the extra column at the end
                        w += T_PAD;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }

        }
        int u = 0;
        for(int k = 0; k < kPatternCount; k++) {
            REALTYPE sumOverI = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                u++;
            }

            if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
                int cumulativeScalingFactorIndex;
                cumulativeScalingFactorIndex = scalingFactorsIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        tmpScaleFactor = gScaleBuffers[scalingFactorsIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sumOverI *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }



            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sumOverI;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sumOverI;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sumOverI;
            }

        }

    }

    if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }


    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}